

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::GenerateUtf8CheckCodeForCord
          (cpp *this,FieldDescriptor *field,Options *options,bool for_parse,string_view parameters,
          Formatter *format)

{
  string_view strict_function;
  string_view verify_function;
  string_view params;
  byte bVar1;
  Options *options_00;
  Options *field_00;
  Printer *p;
  undefined7 in_register_00000009;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  FieldDescriptor *local_48;
  char *local_40;
  Formatter *local_38;
  Formatter *format_local;
  Options *pOStack_28;
  bool for_parse_local;
  Options *options_local;
  FieldDescriptor *field_local;
  string_view parameters_local;
  
  field_local = (FieldDescriptor *)CONCAT71(in_register_00000009,for_parse);
  local_38 = (Formatter *)parameters._M_str;
  parameters_local._M_len = parameters._M_len;
  format_local._7_1_ = (byte)options & 1;
  pOStack_28 = (Options *)field;
  options_local = (Options *)this;
  p = Formatter::printer(local_38);
  field_00 = options_local;
  options_00 = pOStack_28;
  bVar1 = format_local._7_1_;
  local_48 = field_local;
  local_40 = (char *)parameters_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,"VerifyUtf8Cord");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"VerifyUTF8CordNamedField");
  params._M_str = local_40;
  params._M_len = (size_t)local_48;
  strict_function._M_str = local_58._M_str;
  strict_function._M_len = local_58._M_len;
  verify_function._M_str = local_68._M_str;
  verify_function._M_len = local_68._M_len;
  GenerateUtf8CheckCode
            (p,(FieldDescriptor *)field_00,options_00,(bool)(bVar1 & 1),params,strict_function,
             verify_function);
  return;
}

Assistant:

void GenerateUtf8CheckCodeForCord(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  absl::string_view parameters,
                                  const Formatter& format) {
  GenerateUtf8CheckCode(format.printer(), field, options, for_parse, parameters,
                        "VerifyUtf8Cord", "VerifyUTF8CordNamedField");
}